

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_5733c63::RawTRDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,RawTRDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> scripts,
          FlatSigningProvider *out)

{
  pointer pCVar1;
  bool bVar2;
  long in_FS_OFFSET;
  XOnlyPubKey xpk;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_a8;
  undefined1 local_60;
  direct_or_indirect local_58;
  uint local_3c;
  XOnlyPubKey local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pCVar1 != 0x41) {
    __assert_fail("keys.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                  ,0x55d,
                  "virtual std::vector<CScript> (anonymous namespace)::RawTRDescriptor::MakeScripts(const std::vector<CPubKey> &, Span<const CScript>, FlatSigningProvider &) const"
                 );
  }
  local_38.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)(pCVar1->vch + 1);
  local_38.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(pCVar1->vch + 9);
  local_38.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)(pCVar1->vch + 0x11);
  local_38.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)(pCVar1->vch + 0x19);
  bVar2 = XOnlyPubKey::IsFullyValid(&local_38);
  if (bVar2) {
    local_a8._M_first._M_storage._M_storage[0x10] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10];
    local_a8._M_first._M_storage._M_storage[0x11] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11];
    local_a8._M_first._M_storage._M_storage[0x12] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12];
    local_a8._M_first._M_storage._M_storage[0x13] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13];
    local_a8._M_first._M_storage._M_storage[0x14] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14];
    local_a8._M_first._M_storage._M_storage[0x15] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15];
    local_a8._M_first._M_storage._M_storage[0x16] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16];
    local_a8._M_first._M_storage._M_storage[0x17] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17];
    local_a8._M_first._M_storage._M_storage[0x18] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18];
    local_a8._M_first._M_storage._M_storage[0x19] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19];
    local_a8._M_first._M_storage._M_storage[0x1a] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a];
    local_a8._M_first._M_storage._M_storage[0x1b] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b];
    local_a8._M_first._M_storage._M_storage[0x1c] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c];
    local_a8._M_first._M_storage._M_storage[0x1d] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d];
    local_a8._M_first._M_storage._M_storage[0x1e] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e];
    local_a8._M_first._M_storage._M_storage[0x1f] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_a8._M_first._M_storage._M_storage[0] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0];
    local_a8._M_first._M_storage._M_storage[1] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[1];
    local_a8._M_first._M_storage._M_storage[2] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[2];
    local_a8._M_first._M_storage._M_storage[3] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[3];
    local_a8._M_first._M_storage._M_storage[4] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[4];
    local_a8._M_first._M_storage._M_storage[5] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[5];
    local_a8._M_first._M_storage._M_storage[6] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[6];
    local_a8._M_first._M_storage._M_storage[7] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[7];
    local_a8._M_first._M_storage._M_storage[8] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[8];
    local_a8._M_first._M_storage._M_storage[9] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[9];
    local_a8._M_first._M_storage._M_storage[10] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[10];
    local_a8._M_first._M_storage._M_storage[0xb] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb];
    local_a8._M_first._M_storage._M_storage[0xc] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc];
    local_a8._M_first._M_storage._M_storage[0xd] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd];
    local_a8._M_first._M_storage._M_storage[0xe] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe];
    local_a8._M_first._M_storage._M_storage[0xf] =
         local_38.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf];
    local_60 = 6;
    GetScriptForDestination
              ((CScript *)&local_58.indirect_contents,(CTxDestination *)&local_a8._M_first);
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              (__return_storage_ptr__,(CScript *)&local_58.indirect_contents);
    if (0x1c < local_3c) {
      free(local_58.indirect_contents.indirect);
      local_58.indirect_contents.indirect = (char *)0x0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_a8._M_first);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript> scripts, FlatSigningProvider& out) const override
    {
        assert(keys.size() == 1);
        XOnlyPubKey xpk(keys[0]);
        if (!xpk.IsFullyValid()) return {};
        WitnessV1Taproot output{xpk};
        return Vector(GetScriptForDestination(output));
    }